

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_refine_qualities.cpp
# Opt level: O0

Reals __thiscall Omega_h::refine_qualities_tmpl<3,1>(Omega_h *this,Mesh *mesh,LOs *candidates)

{
  LO size_in;
  void *extraout_RDX;
  Int ent_dim;
  Reals RVar1;
  Read<int> local_230;
  Read<double> local_220;
  Write<double> local_210;
  undefined1 local_200 [8];
  Reals cand_quals;
  type f;
  string local_148 [32];
  undefined1 local_128 [8];
  Write<double> quals_w;
  undefined1 local_108 [8];
  MetricRefineQualities<3,_3> measure;
  undefined1 local_e0 [4];
  LO ncands;
  Reals coords;
  Read<signed_char> ec_codes;
  LOs ec2c;
  LOs e2ec;
  Adj e2c;
  undefined1 local_60 [8];
  LOs cv2v;
  LOs ev2v;
  LOs *candidates_local;
  Mesh *mesh_local;
  element_type *local_10;
  
  ent_dim = (Int)mesh;
  Mesh::ask_verts_of((Mesh *)&cv2v.write_.shared_alloc_.direct_ptr,ent_dim);
  Mesh::ask_verts_of((Mesh *)local_60,ent_dim);
  Mesh::ask_up((Adj *)&e2ec.write_.shared_alloc_.direct_ptr,mesh,1,3);
  Read<int>::Read((Read<int> *)&ec2c.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&e2ec.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&ec_codes.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&e2c.super_Graph.a2ab.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&coords.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&e2c.super_Graph.ab2b.write_.shared_alloc_.direct_ptr);
  Mesh::coords((Mesh *)local_e0);
  if (((ulong)(candidates->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (element_type *)((candidates->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (element_type *)((ulong)(candidates->write_).shared_alloc_.alloc >> 3);
  }
  measure.midpt_metrics.write_.shared_alloc_.direct_ptr._4_4_ = (LO)((ulong)local_10 >> 2);
  Read<int>::Read((Read<int> *)&quals_w.shared_alloc_.direct_ptr,candidates);
  MetricRefineQualities<3,_1>::MetricRefineQualities
            ((MetricRefineQualities<3,_1> *)local_108,mesh,(LOs *)&quals_w.shared_alloc_.direct_ptr)
  ;
  Read<int>::~Read((Read<int> *)&quals_w.shared_alloc_.direct_ptr);
  size_in = measure.midpt_metrics.write_.shared_alloc_.direct_ptr._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_148,"",(allocator *)((long)&f.quals_w.shared_alloc_.direct_ptr + 7));
  Write<double>::Write((Write<double> *)local_128,size_in,(string *)local_148);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.quals_w.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)&cand_quals.write_.shared_alloc_.direct_ptr,candidates);
  Read<int>::Read((Read<int> *)&f.candidates.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&cv2v.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&f.ev2v.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_e0);
  Read<int>::Read((Read<int> *)&f.coords.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&ec2c.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.e2ec.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&ec_codes.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.ec2c.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&coords.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.ec_codes.write_.shared_alloc_.direct_ptr,(Read<int> *)local_60);
  MetricRefineQualities<3,_1>::MetricRefineQualities
            ((MetricRefineQualities<3,_1> *)&f.cv2v.write_.shared_alloc_.direct_ptr,
             (MetricRefineQualities<3,_3> *)local_108);
  Write<double>::Write
            ((Write<double> *)&f.measure.midpt_metrics.write_.shared_alloc_.direct_ptr,
             (Write<double> *)local_128);
  parallel_for<Omega_h::refine_qualities_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<int>)::_lambda(int)_1_>
            (measure.midpt_metrics.write_.shared_alloc_.direct_ptr._4_4_,
             (type *)&cand_quals.write_.shared_alloc_.direct_ptr,"refine_qualities");
  Write<double>::Write(&local_210,(Write<double> *)local_128);
  Read<double>::Read((Read<double> *)local_200,&local_210);
  Write<double>::~Write(&local_210);
  Read<double>::Read(&local_220,(Read<double> *)local_200);
  Read<int>::Read(&local_230,candidates);
  Mesh::sync_subset_array<double>
            ((Mesh *)this,ent_dim,(Read<double> *)0x1,(LOs *)&local_220,-1.0,(Int)&local_230);
  Read<int>::~Read(&local_230);
  Read<double>::~Read(&local_220);
  Read<double>::~Read((Read<double> *)local_200);
  refine_qualities_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<int>)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)&cand_quals.write_.shared_alloc_.direct_ptr);
  Write<double>::~Write((Write<double> *)local_128);
  MetricRefineQualities<3,_1>::~MetricRefineQualities((MetricRefineQualities<3,_1> *)local_108);
  Read<double>::~Read((Read<double> *)local_e0);
  Read<signed_char>::~Read((Read<signed_char> *)&coords.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&ec_codes.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&ec2c.write_.shared_alloc_.direct_ptr);
  Adj::~Adj((Adj *)&e2ec.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_60);
  Read<int>::~Read((Read<int> *)&cv2v.write_.shared_alloc_.direct_ptr);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals refine_qualities_tmpl(Mesh* mesh, LOs candidates) {
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto cv2v = mesh->ask_verts_of(mesh_dim);
  auto e2c = mesh->ask_up(EDGE, mesh_dim);
  auto e2ec = e2c.a2ab;
  auto ec2c = e2c.ab2b;
  auto ec_codes = e2c.codes;
  auto coords = mesh->coords();
  auto ncands = candidates.size();
  auto measure = MetricRefineQualities<mesh_dim, metric_dim>(mesh, candidates);
  Write<Real> quals_w(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = candidates[cand];
    auto eev2v = gather_verts<2>(ev2v, e);
    auto ep = gather_vectors<2, mesh_dim>(coords, eev2v);
    auto midp = (ep[0] + ep[1]) / 2.;
    auto minqual = 1.0;
    for (auto ec = e2ec[e]; ec < e2ec[e + 1]; ++ec) {
      auto c = ec2c[ec];
      auto code = ec_codes[ec];
      auto cce = code_which_down(code);
      auto rot = code_rotation(code);
      auto ccv2v = gather_verts<mesh_dim + 1>(cv2v, c);
      for (Int eev = 0; eev < 2; ++eev) {
        /* a new cell is formed from an old cell by finding
           its side that is opposite to one of the edge endpoints
           and connecting it to the midpoint to form the new cell
           (see refine_domain_interiors) */
        auto cev = eev ^ rot;
        auto ccv = simplex_down_template(mesh_dim, EDGE, cce, cev);
        auto ccs = simplex_opposite_template(mesh_dim, VERT, ccv);
        Few<LO, mesh_dim> csv2v;
        Few<Vector<mesh_dim>, mesh_dim + 1> ncp;
        for (Int csv = 0; csv < mesh_dim; ++csv) {
          auto ccv2 = simplex_down_template(mesh_dim, mesh_dim - 1, ccs, csv);
          auto v2 = ccv2v[ccv2];
          csv2v[csv] = v2;
          ncp[csv] = get_vector<mesh_dim>(coords, v2);
        }
        ncp[mesh_dim] = midp;
        flip_new_elem<mesh_dim>(&csv2v[0]);
        flip_new_elem<mesh_dim>(&ncp[0]);
        auto cqual = measure.measure(cand, ncp, csv2v);
        minqual = min2(minqual, cqual);
      }
    }
    quals_w[cand] = minqual;
  };
  parallel_for(ncands, f, "refine_qualities");
  auto cand_quals = Reals(quals_w);
  return mesh->sync_subset_array(EDGE, cand_quals, candidates, -1.0, 1);
}